

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NameSyntax *args_2;
  ScopedNameSyntax *pSVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0xa5e3d6);
  args_2 = deepClone<slang::syntax::NameSyntax>
                     ((NameSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0xa5e413);
  deepClone<slang::syntax::NameSyntax>((NameSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::ScopedNameSyntax,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::NameSyntax&>
                     (this,(NameSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const ScopedNameSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ScopedNameSyntax>(
        *deepClone<NameSyntax>(*node.left, alloc),
        node.separator.deepClone(alloc),
        *deepClone<NameSyntax>(*node.right, alloc)
    );
}